

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_compressionParameters * ZSTD_clampCParams(ZSTD_compressionParameters cParams)

{
  bool bVar1;
  undefined1 auVar2 [20];
  ZSTD_compressionParameters *in_RDI;
  ZSTD_bounds ZVar3;
  int in_stack_00000008;
  int in_stack_0000000c;
  ZSTD_bounds bounds_6;
  ZSTD_bounds bounds_5;
  ZSTD_bounds bounds_4;
  ZSTD_bounds bounds_3;
  ZSTD_bounds bounds_2;
  ZSTD_bounds bounds_1;
  ZSTD_bounds bounds;
  
  auVar2 = (undefined1  [20])cParams._0_20_;
  ZVar3 = ZSTD_cParam_getBounds(ZSTD_c_windowLog);
  bounds.error._0_4_ = ZVar3.lowerBound;
  if (in_stack_00000008 < (int)bounds.error) {
    in_stack_00000008 = (int)bounds.error;
  }
  else {
    bounds.error._4_4_ = ZVar3.upperBound;
    if (bounds.error._4_4_ < in_stack_00000008) {
      in_stack_00000008 = bounds.error._4_4_;
    }
  }
  ZVar3 = ZSTD_cParam_getBounds(ZSTD_c_chainLog);
  bounds_1.error._0_4_ = ZVar3.lowerBound;
  if (in_stack_0000000c < (int)bounds_1.error) {
    in_stack_0000000c = (int)bounds_1.error;
  }
  else {
    bounds_1.error._4_4_ = ZVar3.upperBound;
    if (bounds_1.error._4_4_ < in_stack_0000000c) {
      in_stack_0000000c = bounds_1.error._4_4_;
    }
  }
  ZVar3 = ZSTD_cParam_getBounds(ZSTD_c_hashLog);
  bounds_2.error._0_4_ = ZVar3.lowerBound;
  cParams._0_20_ = auVar2;
  if ((int)cParams.windowLog < (int)(uint)bounds_2.error) {
    cParams.windowLog = (uint)bounds_2.error;
    cParams._0_20_ = (undefined1  [20])cParams._0_20_;
  }
  else {
    bounds_2.error._4_4_ = ZVar3.upperBound;
    bVar1 = (int)bounds_2.error._4_4_ < (int)cParams.windowLog;
    if (bVar1) {
      cParams.windowLog = bounds_2.error._4_4_;
    }
  }
  ZSTD_cParam_getBounds(ZSTD_c_searchLog);
  ZSTD_cParam_getBounds(ZSTD_c_minMatch);
  ZSTD_cParam_getBounds(ZSTD_c_targetLength);
  ZVar3 = ZSTD_cParam_getBounds(ZSTD_c_strategy);
  bounds_6.error._0_4_ = ZVar3.lowerBound;
  if ((int)cParams.minMatch < (int)(uint)bounds_6.error) {
    cParams.minMatch = (uint)bounds_6.error;
  }
  else {
    bounds_6.error._4_4_ = ZVar3.upperBound;
    if ((int)bounds_6.error._4_4_ < (int)cParams.minMatch) {
      cParams.minMatch = bounds_6.error._4_4_;
    }
  }
  auVar2 = (undefined1  [20])cParams._0_20_;
  in_RDI->windowLog = in_stack_00000008;
  in_RDI->chainLog = in_stack_0000000c;
  in_RDI->hashLog = cParams.windowLog;
  in_RDI->searchLog = cParams.chainLog;
  cParams._8_8_ = auVar2._8_8_;
  in_RDI->minMatch = cParams.hashLog;
  in_RDI->targetLength = cParams.searchLog;
  cParams.minMatch = auVar2._16_4_;
  in_RDI->strategy = cParams.minMatch;
  return in_RDI;
}

Assistant:

static ZSTD_compressionParameters
ZSTD_clampCParams(ZSTD_compressionParameters cParams)
{
#   define CLAMP_TYPE(cParam, val, type) {                                \
        ZSTD_bounds const bounds = ZSTD_cParam_getBounds(cParam);         \
        if ((int)val<bounds.lowerBound) val=(type)bounds.lowerBound;      \
        else if ((int)val>bounds.upperBound) val=(type)bounds.upperBound; \
    }
#   define CLAMP(cParam, val) CLAMP_TYPE(cParam, val, int)
    CLAMP(ZSTD_c_windowLog, cParams.windowLog);
    CLAMP(ZSTD_c_chainLog,  cParams.chainLog);
    CLAMP(ZSTD_c_hashLog,   cParams.hashLog);
    CLAMP(ZSTD_c_searchLog, cParams.searchLog);
    CLAMP(ZSTD_c_minMatch,  cParams.minMatch);
    CLAMP(ZSTD_c_targetLength,cParams.targetLength);
    CLAMP_TYPE(ZSTD_c_strategy,cParams.strategy, ZSTD_strategy);
    return cParams;
}